

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyfit.h
# Opt level: O2

void __thiscall
PolyFit<double>::PolyFit
          (PolyFit<double> *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *y,Options *options)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  double dVar5;
  undefined8 *puVar6;
  undefined4 uVar7;
  
  boost::random::
  mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
  ::seed(&this->gen);
  (this->pCoef).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->pCoef).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->x = x;
  this->y = y;
  (this->xM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->xM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->V).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  (this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  (this->yM).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  (this->V).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->V).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  this->options = options;
  pdVar1 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar2 = (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar4 = (y->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (((pdVar1 == pdVar2) || (pdVar4 == pdVar3)) ||
     ((long)pdVar1 - (long)pdVar2 != (long)pdVar4 - (long)pdVar3)) {
    dVar5 = logging::log(&logger,0.0);
    uVar7 = SUB84(dVar5,0);
  }
  else {
    if (0 < options->polyDeg) {
      dataToEigen(this);
      return;
    }
    dVar5 = logging::log(&logger,0.0);
    uVar7 = SUB84(dVar5,0);
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(uVar7,8);
  *puVar6 = std::istream::read;
  __cxa_throw(puVar6,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

PolyFit(std::vector<T> &x, std::vector<T> &y, Options &options): 
      x(x), y(y), options(options) 
    {
      if (!x.size() || !y.size() || (x.size() != y.size()))
      {
        logger.log(ERROR, "[%s]: Size mismatch (%d,%d)\n",
            __func__, x.size(), y.size());
        throw std::exception();
      }

      if (options.polyDeg < 1)
      {
        logger.log(ERROR, "[%s]: Polynomial degree < 1\n",
            __func__);
        throw std::exception();
      }
      dataToEigen();
    }